

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SortByPTypeProcess.cpp
# Opt level: O0

void UpdateNodes(vector<unsigned_int,_std::allocator<unsigned_int>_> *replaceMeshIndex,aiNode *node)

{
  uint uVar1;
  int iVar2;
  const_reference pvVar3;
  ulong uVar4;
  value_type *local_68;
  uint local_54;
  uint local_50;
  uint m_2;
  uint i_1;
  uint add_1;
  uint m_1;
  value_type *local_30;
  uint *newMeshes;
  uint i;
  uint add;
  uint m;
  uint newSize;
  aiNode *node_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *replaceMeshIndex_local;
  
  if (node->mNumMeshes != 0) {
    add = 0;
    for (i = 0; i < node->mNumMeshes; i = i + 1) {
      uVar1 = node->mMeshes[i];
      for (newMeshes._0_4_ = 0; (uint)newMeshes < 4; newMeshes._0_4_ = (uint)newMeshes + 1) {
        pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (replaceMeshIndex,(ulong)(uVar1 * 4 + (uint)newMeshes));
        if (*pvVar3 != 0xffffffff) {
          add = add + 1;
        }
      }
    }
    if (add == 0) {
      if (node->mMeshes != (uint *)0x0) {
        operator_delete__(node->mMeshes);
      }
      node->mNumMeshes = 0;
      node->mMeshes = (uint *)0x0;
    }
    else {
      if (node->mNumMeshes < add) {
        uVar4 = SUB168(ZEXT416(add) * ZEXT816(4),0);
        if (SUB168(ZEXT416(add) * ZEXT816(4),8) != 0) {
          uVar4 = 0xffffffffffffffff;
        }
        local_68 = (value_type *)operator_new__(uVar4);
      }
      else {
        local_68 = node->mMeshes;
      }
      local_30 = local_68;
      for (i_1 = 0; i_1 < node->mNumMeshes; i_1 = i_1 + 1) {
        iVar2 = node->mMeshes[i_1] * 4;
        for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
          pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             (replaceMeshIndex,(ulong)(iVar2 + local_50));
          if (*pvVar3 != 0xffffffff) {
            pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (replaceMeshIndex,(ulong)(iVar2 + local_50));
            *local_30 = *pvVar3;
            local_30 = local_30 + 1;
          }
        }
      }
      if ((node->mNumMeshes < add) && (node->mMeshes != (uint *)0x0)) {
        operator_delete__(node->mMeshes);
      }
      node->mNumMeshes = add;
      node->mMeshes = local_30 + -(ulong)add;
    }
  }
  for (local_54 = 0; local_54 < node->mNumChildren; local_54 = local_54 + 1) {
    UpdateNodes(replaceMeshIndex,node->mChildren[local_54]);
  }
  return;
}

Assistant:

void UpdateNodes(const std::vector<unsigned int>& replaceMeshIndex, aiNode* node)
{
    if (node->mNumMeshes)
    {
        unsigned int newSize = 0;
        for (unsigned int m = 0; m< node->mNumMeshes; ++m)
        {
            unsigned int add = node->mMeshes[m]<<2;
            for (unsigned int i = 0; i < 4;++i)
            {
                if (UINT_MAX != replaceMeshIndex[add+i])++newSize;
            }
        }
        if (!newSize)
        {
            delete[] node->mMeshes;
            node->mNumMeshes = 0;
            node->mMeshes    = NULL;
        }
        else
        {
            // Try to reuse the old array if possible
            unsigned int* newMeshes = (newSize > node->mNumMeshes
                ? new unsigned int[newSize] : node->mMeshes);

            for (unsigned int m = 0; m< node->mNumMeshes; ++m)
            {
                unsigned int add = node->mMeshes[m]<<2;
                for (unsigned int i = 0; i < 4;++i)
                {
                    if (UINT_MAX != replaceMeshIndex[add+i])
                        *newMeshes++ = replaceMeshIndex[add+i];
                }
            }
            if (newSize > node->mNumMeshes)
                delete[] node->mMeshes;

            node->mMeshes = newMeshes-(node->mNumMeshes = newSize);
        }
    }

    // call all subnodes recursively
    for (unsigned int m = 0; m < node->mNumChildren; ++m)
        UpdateNodes(replaceMeshIndex,node->mChildren[m]);
}